

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::LargeHeapBlock::ScanInitialImplicitRoots(LargeHeapBlock *this,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  LargeObjectHeader *this_00;
  void **obj;
  size_t byteCount;
  undefined8 *in_FS_OFFSET;
  size_t objectSize;
  char *objectAddress;
  LargeObjectHeader *header;
  uint objectIndex;
  HeapBlockMap *heapBlockMap;
  Recycler *recycler_local;
  LargeHeapBlock *this_local;
  
  if ((recycler->enableScanImplicitRoots & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x439,"(recycler->enableScanImplicitRoots)",
                       "recycler->enableScanImplicitRoots");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  for (header._4_4_ = 0; header._4_4_ < this->allocCount; header._4_4_ = header._4_4_ + 1) {
    this_00 = GetHeaderByIndex(this,header._4_4_);
    if ((this_00 != (LargeObjectHeader *)0x0) &&
       (bVar3 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie),
       (bVar3 & 0x20) == 0)) {
      obj = (void **)LargeObjectHeader::GetAddress(this_00);
      bVar2 = HeapBlockMap64::IsMarked(&recycler->heapBlockMap,obj);
      if (bVar2) {
        if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
          RecyclerObjectGraphDumper::BeginDumpObject(recycler->objectGraphDumper,L"Implicit Root");
        }
        if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
          RecyclerObjectGraphDumper::DumpObjectReference(recycler->objectGraphDumper,obj,false);
        }
        if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
          RecyclerObjectGraphDumper::EndDumpObject(recycler->objectGraphDumper);
        }
        bVar2 = InPageHeapMode(this);
        if (bVar2) {
          byteCount = HeapInfo::RoundObjectSize(this_00->objectSize);
          if (byteCount != 0) {
            Recycler::ScanObjectInlineInterior(recycler,obj,byteCount);
          }
        }
        else {
          Recycler::ScanObjectInlineInterior(recycler,obj,this_00->objectSize);
        }
      }
    }
  }
  return;
}

Assistant:

void
LargeHeapBlock::ScanInitialImplicitRoots(Recycler * recycler)
{
    Assert(recycler->enableScanImplicitRoots);
    const HeapBlockMap& heapBlockMap = recycler->heapBlockMap;
    for (uint objectIndex = 0; objectIndex < allocCount; objectIndex++)
    {
        // object is allocated during the concurrent mark or it is marked, do rescan
        LargeObjectHeader * header = this->GetHeaderByIndex(objectIndex);
        // check if the object index is not allocated
        if (header == nullptr)
        {
            continue;
        }

        // check whether the object is a leaf and doesn't need to be scanned
        if ((header->GetAttributes(this->heapInfo->recycler->Cookie) & LeafBit) != 0)
        {
            continue;
        }

        char * objectAddress = (char *)header->GetAddress();

        // it is not marked, don't scan implicit root
        if (!heapBlockMap.IsMarked(objectAddress))
        {
            continue;
        }

        // TODO: Assume scan interior?
        DUMP_IMPLICIT_ROOT(recycler, objectAddress);

#ifdef RECYCLER_PAGE_HEAP
        if (this->InPageHeapMode())
        {
            size_t objectSize = header->objectSize;
            // trim off the trailing part which is not a pointer
            objectSize = HeapInfo::RoundObjectSize(objectSize);
            if (objectSize > 0) // otherwise the object total size is less than a pointer size
            {
                recycler->ScanObjectInlineInterior((void **)objectAddress, objectSize);
            }
        }
        else
#endif
        {
            recycler->ScanObjectInlineInterior((void **)objectAddress, header->objectSize);
        }
    }
}